

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemX_image.cpp
# Opt level: O0

int Am_Image_Array_Data::remove(char *__filename)

{
  undefined8 uVar1;
  Bitmap_Item *local_40;
  Bitmap_Item *curr_index;
  Bitmap_Item *prev;
  int i;
  Colormap c;
  Am_Image_Array_Data *pAStack_18;
  int screen_num;
  Am_Image_Array_Data *curr;
  Display *display_local;
  
  pAStack_18 = list;
  do {
    if (pAStack_18 == (Am_Image_Array_Data *)0x0) {
      return 0;
    }
    if (pAStack_18->main_display == (Display *)__filename) {
      if (pAStack_18->colors != (XColor *)0x0) {
        uVar1 = XDefaultColormap(pAStack_18->main_display,
                                 *(undefined4 *)(pAStack_18->main_display + 0xe0));
        for (prev._4_4_ = 0; prev._4_4_ < pAStack_18->num_colors; prev._4_4_ = prev._4_4_ + 1) {
          XFreeColors(pAStack_18->main_display,uVar1,pAStack_18->colors + prev._4_4_,1,0);
        }
        if (pAStack_18->colors != (XColor *)0x0) {
          operator_delete__(pAStack_18->colors);
        }
        pAStack_18->colors = (XColor *)0x0;
      }
      if ((pAStack_18->main_display != (Display *)0x0) && (pAStack_18->main_bitmap != 0)) {
        XFreePixmap(pAStack_18->main_display,pAStack_18->main_bitmap);
      }
      pAStack_18->main_display = (Display *)0x0;
    }
    curr_index = (Bitmap_Item *)0x0;
    for (local_40 = pAStack_18->head; local_40 != (Bitmap_Item *)0x0; local_40 = local_40->next) {
      if (local_40->display == (Display *)__filename) {
        if (curr_index == (Bitmap_Item *)0x0) {
          pAStack_18->head = local_40->next;
        }
        else {
          curr_index->next = local_40->next;
        }
        if (local_40 != (Bitmap_Item *)0x0) {
          Bitmap_Item::~Bitmap_Item(local_40);
          operator_delete(local_40);
        }
        break;
      }
      curr_index = local_40;
    }
    pAStack_18 = pAStack_18->next;
  } while( true );
}

Assistant:

void
Am_Image_Array_Data::remove(Display *display)
{
  Am_Image_Array_Data *curr;
  for (curr = list; curr; curr = curr->next) {
    if (curr->main_display == display) {
      if (curr->colors) {
        int screen_num = DefaultScreen(curr->main_display);
        Colormap c = XDefaultColormap(curr->main_display, screen_num);
        for (int i = 0; i < curr->num_colors; i++)
          XFreeColors(curr->main_display, c, &(curr->colors[i].pixel), 1, 0);
        delete[] curr->colors;
        curr->colors = nullptr;
      }
      if (curr->main_display && curr->main_bitmap)
        XFreePixmap(curr->main_display, curr->main_bitmap);
      curr->main_display = nullptr;
    }
    Bitmap_Item *prev = nullptr;
    Bitmap_Item *curr_index = curr->head;
    while (curr_index) {
      if (curr_index->display == display) {
        if (prev)
          prev->next = curr_index->next;
        else
          curr->head = curr_index->next;
        delete curr_index;
        break;
      }
      prev = curr_index;
      curr_index = curr_index->next;
    }
  }
}